

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O3

void nlohmann::detail::dtoa_impl::grisu2_digit_gen
               (char *buffer,int *length,int *decimal_exponent,diyfp M_minus,diyfp w,diyfp M_plus)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  byte bVar4;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  bool bVar16;
  
  bVar4 = -(char)M_plus.e;
  uVar5 = 1L << (bVar4 & 0x3f);
  uVar3 = M_plus.f >> (bVar4 & 0x3f);
  uVar2 = (uint)uVar3;
  if (uVar2 < 1000000000) {
    if (uVar2 < 100000000) {
      if (uVar2 < 10000000) {
        if (uVar2 < 1000000) {
          if (uVar2 < 100000) {
            if (uVar2 < 10000) {
              if (uVar2 < 1000) {
                if (uVar2 < 100) {
                  uVar13 = (uint)(9 < uVar2) * 9 + 1;
                  iVar7 = (9 < uVar2) + 1;
                }
                else {
                  iVar7 = 3;
                  uVar13 = 100;
                }
              }
              else {
                iVar7 = 4;
                uVar13 = 1000;
              }
            }
            else {
              iVar7 = 5;
              uVar13 = 10000;
            }
          }
          else {
            iVar7 = 6;
            uVar13 = 100000;
          }
        }
        else {
          iVar7 = 7;
          uVar13 = 1000000;
        }
      }
      else {
        iVar7 = 8;
        uVar13 = 10000000;
      }
    }
    else {
      iVar7 = 9;
      uVar13 = 100000000;
    }
  }
  else {
    iVar7 = 10;
    uVar13 = 1000000000;
  }
  uVar9 = M_plus.f - M_minus.f;
  uVar14 = M_plus.f - w.f;
  uVar15 = uVar5 - 1 & M_plus.f;
  do {
    if (iVar7 < 1) {
      iVar7 = 0;
      do {
        uVar12 = uVar14;
        uVar6 = uVar9;
        uVar3 = uVar15 * 10;
        uVar15 = uVar3 & uVar5 - 1;
        iVar1 = *length;
        *length = iVar1 + 1;
        buffer[iVar1] = (char)(uVar3 >> (bVar4 & 0x3f)) + '0';
        uVar9 = uVar6 * 10;
        uVar14 = uVar12 * 10;
        iVar7 = iVar7 + -1;
      } while (uVar9 < uVar15);
      *decimal_exponent = *decimal_exponent + iVar7;
      if ((uVar15 < uVar14) && (uVar5 <= uVar9 - uVar15)) {
        iVar7 = *length;
        uVar3 = uVar12 * 10 - uVar15;
        uVar15 = uVar15 + uVar5;
        uVar9 = uVar6 * 10 - uVar15;
        do {
          if ((uVar14 <= uVar15) && (uVar3 <= uVar12 * -10 + uVar15)) {
            return;
          }
          buffer[(long)iVar7 + -1] = buffer[(long)iVar7 + -1] + -1;
          bVar16 = uVar5 <= uVar9;
          uVar9 = uVar9 - uVar5;
          if (uVar14 <= uVar15) {
            return;
          }
          uVar3 = uVar3 - uVar5;
          uVar15 = uVar15 + uVar5;
        } while (bVar16);
      }
      return;
    }
    uVar6 = uVar3 & 0xffffffff;
    uVar3 = uVar6 % (ulong)uVar13;
    iVar1 = *length;
    *length = iVar1 + 1;
    buffer[iVar1] = (char)(uVar6 / uVar13) + '0';
    iVar7 = iVar7 + -1;
    uVar6 = (uVar3 << (bVar4 & 0x3f)) + uVar15;
    if (uVar9 < uVar6) {
      uVar13 = uVar13 / 10;
    }
    else {
      *decimal_exponent = *decimal_exponent + iVar7;
      uVar12 = (ulong)uVar13 << (bVar4 & 0x3f);
      if (uVar14 <= uVar6) {
        return;
      }
      if (uVar9 - uVar6 < uVar12) {
        return;
      }
      iVar1 = *length;
      uVar8 = (M_plus.f - w.f) - uVar6;
      uVar10 = uVar6 + uVar12;
      uVar11 = (M_plus.f - M_minus.f) - uVar10;
      do {
        if ((uVar14 <= uVar10) && (uVar8 <= (w.f - M_plus.f) + uVar10)) break;
        buffer[(long)iVar1 + -1] = buffer[(long)iVar1 + -1] + -1;
        bVar16 = uVar12 <= uVar11;
        uVar11 = uVar11 - uVar12;
        if (uVar14 <= uVar10) break;
        uVar8 = uVar8 - uVar12;
        uVar10 = uVar10 + uVar12;
      } while (bVar16);
    }
    if (uVar6 <= uVar9) {
      return;
    }
  } while( true );
}

Assistant:

inline void grisu2_digit_gen(char* buffer, int& length, int& decimal_exponent,
                             diyfp M_minus, diyfp w, diyfp M_plus)
{
    static_assert(kAlpha >= -60, "internal error");
    static_assert(kGamma <= -32, "internal error");

    // Generates the digits (and the exponent) of a decimal floating-point
    // number V = buffer * 10^decimal_exponent in the range [M-, M+]. The diyfp's
    // w, M- and M+ share the same exponent e, which satisfies alpha <= e <= gamma.
    //
    //               <--------------------------- delta ---->
    //                                  <---- dist --------->
    // --------------[------------------+-------------------]--------------
    //               M-                 w                   M+
    //
    // Grisu2 generates the digits of M+ from left to right and stops as soon as
    // V is in [M-,M+].

    assert(M_plus.e >= kAlpha);
    assert(M_plus.e <= kGamma);

    uint64_t delta = diyfp::sub(M_plus, M_minus).f; // (significand of (M+ - M-), implicit exponent is e)
    uint64_t dist  = diyfp::sub(M_plus, w      ).f; // (significand of (M+ - w ), implicit exponent is e)

    // Split M+ = f * 2^e into two parts p1 and p2 (note: e < 0):
    //
    //      M+ = f * 2^e
    //         = ((f div 2^-e) * 2^-e + (f mod 2^-e)) * 2^e
    //         = ((p1        ) * 2^-e + (p2        )) * 2^e
    //         = p1 + p2 * 2^e

    const diyfp one(uint64_t{1} << -M_plus.e, M_plus.e);

    uint32_t p1 = static_cast<uint32_t>(M_plus.f >> -one.e); // p1 = f div 2^-e (Since -e >= 32, p1 fits into a 32-bit int.)
    uint64_t p2 = M_plus.f & (one.f - 1);                    // p2 = f mod 2^-e

    // 1)
    //
    // Generate the digits of the integral part p1 = d[n-1]...d[1]d[0]

    assert(p1 > 0);

    uint32_t pow10;
    const int k = find_largest_pow10(p1, pow10);

    //      10^(k-1) <= p1 < 10^k, pow10 = 10^(k-1)
    //
    //      p1 = (p1 div 10^(k-1)) * 10^(k-1) + (p1 mod 10^(k-1))
    //         = (d[k-1]         ) * 10^(k-1) + (p1 mod 10^(k-1))
    //
    //      M+ = p1                                             + p2 * 2^e
    //         = d[k-1] * 10^(k-1) + (p1 mod 10^(k-1))          + p2 * 2^e
    //         = d[k-1] * 10^(k-1) + ((p1 mod 10^(k-1)) * 2^-e + p2) * 2^e
    //         = d[k-1] * 10^(k-1) + (                         rest) * 2^e
    //
    // Now generate the digits d[n] of p1 from left to right (n = k-1,...,0)
    //
    //      p1 = d[k-1]...d[n] * 10^n + d[n-1]...d[0]
    //
    // but stop as soon as
    //
    //      rest * 2^e = (d[n-1]...d[0] * 2^-e + p2) * 2^e <= delta * 2^e

    int n = k;
    while (n > 0)
    {
        // Invariants:
        //      M+ = buffer * 10^n + (p1 + p2 * 2^e)    (buffer = 0 for n = k)
        //      pow10 = 10^(n-1) <= p1 < 10^n
        //
        const uint32_t d = p1 / pow10;  // d = p1 div 10^(n-1)
        const uint32_t r = p1 % pow10;  // r = p1 mod 10^(n-1)
        //
        //      M+ = buffer * 10^n + (d * 10^(n-1) + r) + p2 * 2^e
        //         = (buffer * 10 + d) * 10^(n-1) + (r + p2 * 2^e)
        //
        assert(d <= 9);
        buffer[length++] = static_cast<char>('0' + d); // buffer := buffer * 10 + d
        //
        //      M+ = buffer * 10^(n-1) + (r + p2 * 2^e)
        //
        p1 = r;
        n--;
        //
        //      M+ = buffer * 10^n + (p1 + p2 * 2^e)
        //      pow10 = 10^n
        //

        // Now check if enough digits have been generated.
        // Compute
        //
        //      p1 + p2 * 2^e = (p1 * 2^-e + p2) * 2^e = rest * 2^e
        //
        // Note:
        // Since rest and delta share the same exponent e, it suffices to
        // compare the significands.
        const uint64_t rest = (uint64_t{p1} << -one.e) + p2;
        if (rest <= delta)
        {
            // V = buffer * 10^n, with M- <= V <= M+.

            decimal_exponent += n;

            // We may now just stop. But instead look if the buffer could be
            // decremented to bring V closer to w.
            //
            // pow10 = 10^n is now 1 ulp in the decimal representation V.
            // The rounding procedure works with diyfp's with an implicit
            // exponent of e.
            //
            //      10^n = (10^n * 2^-e) * 2^e = ulp * 2^e
            //
            const uint64_t ten_n = uint64_t{pow10} << -one.e;
            grisu2_round(buffer, length, dist, delta, rest, ten_n);

            return;
        }

        pow10 /= 10;
        //
        //      pow10 = 10^(n-1) <= p1 < 10^n
        // Invariants restored.
    }

    // 2)
    //
    // The digits of the integral part have been generated:
    //
    //      M+ = d[k-1]...d[1]d[0] + p2 * 2^e
    //         = buffer            + p2 * 2^e
    //
    // Now generate the digits of the fractional part p2 * 2^e.
    //
    // Note:
    // No decimal point is generated: the exponent is adjusted instead.
    //
    // p2 actually represents the fraction
    //
    //      p2 * 2^e
    //          = p2 / 2^-e
    //          = d[-1] / 10^1 + d[-2] / 10^2 + ...
    //
    // Now generate the digits d[-m] of p1 from left to right (m = 1,2,...)
    //
    //      p2 * 2^e = d[-1]d[-2]...d[-m] * 10^-m
    //                      + 10^-m * (d[-m-1] / 10^1 + d[-m-2] / 10^2 + ...)
    //
    // using
    //
    //      10^m * p2 = ((10^m * p2) div 2^-e) * 2^-e + ((10^m * p2) mod 2^-e)
    //                = (                   d) * 2^-e + (                   r)
    //
    // or
    //      10^m * p2 * 2^e = d + r * 2^e
    //
    // i.e.
    //
    //      M+ = buffer + p2 * 2^e
    //         = buffer + 10^-m * (d + r * 2^e)
    //         = (buffer * 10^m + d) * 10^-m + 10^-m * r * 2^e
    //
    // and stop as soon as 10^-m * r * 2^e <= delta * 2^e

    assert(p2 > delta);

    int m = 0;
    for (;;)
    {
        // Invariant:
        //      M+ = buffer * 10^-m + 10^-m * (d[-m-1] / 10 + d[-m-2] / 10^2 + ...) * 2^e
        //         = buffer * 10^-m + 10^-m * (p2                                 ) * 2^e
        //         = buffer * 10^-m + 10^-m * (1/10 * (10 * p2)                   ) * 2^e
        //         = buffer * 10^-m + 10^-m * (1/10 * ((10*p2 div 2^-e) * 2^-e + (10*p2 mod 2^-e)) * 2^e
        //
        assert(p2 <= UINT64_MAX / 10);
        p2 *= 10;
        const uint64_t d = p2 >> -one.e;     // d = (10 * p2) div 2^-e
        const uint64_t r = p2 & (one.f - 1); // r = (10 * p2) mod 2^-e
        //
        //      M+ = buffer * 10^-m + 10^-m * (1/10 * (d * 2^-e + r) * 2^e
        //         = buffer * 10^-m + 10^-m * (1/10 * (d + r * 2^e))
        //         = (buffer * 10 + d) * 10^(-m-1) + 10^(-m-1) * r * 2^e
        //
        assert(d <= 9);
        buffer[length++] = static_cast<char>('0' + d); // buffer := buffer * 10 + d
        //
        //      M+ = buffer * 10^(-m-1) + 10^(-m-1) * r * 2^e
        //
        p2 = r;
        m++;
        //
        //      M+ = buffer * 10^-m + 10^-m * p2 * 2^e
        // Invariant restored.

        // Check if enough digits have been generated.
        //
        //      10^-m * p2 * 2^e <= delta * 2^e
        //              p2 * 2^e <= 10^m * delta * 2^e
        //                    p2 <= 10^m * delta
        delta *= 10;
        dist  *= 10;
        if (p2 <= delta)
        {
            break;
        }
    }

    // V = buffer * 10^-m, with M- <= V <= M+.

    decimal_exponent -= m;

    // 1 ulp in the decimal representation is now 10^-m.
    // Since delta and dist are now scaled by 10^m, we need to do the
    // same with ulp in order to keep the units in sync.
    //
    //      10^m * 10^-m = 1 = 2^-e * 2^e = ten_m * 2^e
    //
    const uint64_t ten_m = one.f;
    grisu2_round(buffer, length, dist, delta, p2, ten_m);

    // By construction this algorithm generates the shortest possible decimal
    // number (Loitsch, Theorem 6.2) which rounds back to w.
    // For an input number of precision p, at least
    //
    //      N = 1 + ceil(p * log_10(2))
    //
    // decimal digits are sufficient to identify all binary floating-point
    // numbers (Matula, "In-and-Out conversions").
    // This implies that the algorithm does not produce more than N decimal
    // digits.
    //
    //      N = 17 for p = 53 (IEEE double precision)
    //      N = 9  for p = 24 (IEEE single precision)
}